

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O1

void __thiscall QFbCursor::updateMouseStatus(QFbCursor *this)

{
  long lVar1;
  long *plVar2;
  QFbCursor QVar3;
  DeviceType DVar4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x50) == 0) {
    QVar3 = (QFbCursor)0x0;
  }
  else {
    DVar4 = QGuiApplicationPrivate::inputDeviceManager();
    iVar5 = QInputDeviceManager::deviceCount(DVar4);
    QVar3 = (QFbCursor)(0 < iVar5);
  }
  this[0x10] = QVar3;
  plVar2 = *(long **)(this + 0x18);
  if (QVar3 == (QFbCursor)0x0) {
    (**(code **)(*(long *)this + 0xb8))(this);
  }
  else {
    getCurrentRect(this);
  }
  (**(code **)(*plVar2 + 0xd0))(plVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::updateMouseStatus()
{
    mVisible = mDeviceListener ? mDeviceListener->hasMouse() : false;
    mScreen->setDirty(mVisible ? getCurrentRect() : lastPainted());
}